

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTable.h
# Opt level: O0

string * __thiscall
chatra::StringTable::ref_abi_cxx11_(string *__return_storage_ptr__,StringTable *this,StringId id)

{
  const_reference pvVar1;
  StringId id_local;
  StringTable *this_local;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->idToStr,(ulong)id);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ref(StringId id) const {
		#ifndef CHATRA_NDEBUG
			if (id == StringId::Invalid)
				return "#invalid";
		#endif  // !CHATRA_NDEBUG
		chatra_assert(static_cast<size_t>(id) < idToStr.size());
		return idToStr[static_cast<size_t>(id)];
	}